

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void enable_secondary(bool *secondary,bool track_sources,bool track_tests)

{
  filesystem_error *x;
  bool track_tests_local;
  bool track_sources_local;
  bool *secondary_local;
  
  if ((*secondary & 1U) == 0) {
    build_module_dependency_map(track_sources,track_tests);
    *secondary = true;
  }
  return;
}

Assistant:

static void enable_secondary( bool & secondary, bool track_sources, bool track_tests )
{
    if( !secondary )
    {
        try
        {
            build_module_dependency_map( track_sources, track_tests );
        }
        catch( fs::filesystem_error const & x )
        {
            std::cout << x.what() << std::endl;
        }

        secondary = true;
    }
}